

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O2

bool __thiscall
InputSource::findLast
          (InputSource *this,char *start_chars,qpdf_offset_t offset,size_t len,Finder *finder)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long uVar3;
  size_t len_00;
  bool bVar4;
  long lVar5;
  long local_38;
  qpdf_offset_t offset_00;
  
  bVar4 = false;
  len_00 = len;
  offset_00 = offset;
  lVar5 = 0;
  while( true ) {
    bVar1 = findFirst(this,start_chars,offset_00,len_00,finder);
    if (!bVar1) break;
    if (!bVar4) {
      bVar4 = true;
    }
    iVar2 = (*this->_vptr_InputSource[4])(this);
    offset_00 = CONCAT44(extraout_var,iVar2);
    local_38 = offset_00 - offset;
    uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&local_38);
    len_00 = len - uVar3;
    lVar5 = offset_00;
  }
  if (bVar4 != false) {
    (*this->_vptr_InputSource[5])(this,lVar5,0);
  }
  return bVar4;
}

Assistant:

bool
InputSource::findLast(char const* start_chars, qpdf_offset_t offset, size_t len, Finder& finder)
{
    bool found = false;
    qpdf_offset_t after_found_offset = 0;
    qpdf_offset_t cur_offset = offset;
    size_t cur_len = len;
    while (this->findFirst(start_chars, cur_offset, cur_len, finder)) {
        if (found) {
            QTC::TC("libtests", "InputSource findLast found more than one");
        } else {
            found = true;
        }
        after_found_offset = this->tell();
        cur_offset = after_found_offset;
        cur_len = len - QIntC::to_size((cur_offset - offset));
    }
    if (found) {
        this->seek(after_found_offset, SEEK_SET);
    }
    return found;
}